

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_device_read__null
                    (ma_device *pDevice,void *pPCMFrames,ma_uint32 frameCount,ma_uint32 *pFramesRead
                    )

{
  uint uVar1;
  ma_uint32 mVar2;
  ma_uint64 mVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  timespec local_40;
  
  if (pFramesRead != (ma_uint32 *)0x0) {
    *pFramesRead = 0;
  }
  if (frameCount == 0) {
    mVar2 = 0;
  }
  else {
    uVar1 = (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture;
    uVar6 = 0;
    do {
      if (uVar1 == 0) {
        mVar2 = 0;
      }
      else {
        iVar4 = (&DAT_001158a0)[(pDevice->capture).internalFormat] *
                (pDevice->capture).internalChannels;
        uVar5 = frameCount - uVar6;
        if (uVar1 < frameCount - uVar6) {
          uVar5 = uVar1;
        }
        memset((void *)((ulong)(iVar4 * uVar6) + (long)pPCMFrames),0,(ulong)(iVar4 * uVar5));
        mVar2 = (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture - uVar5;
        uVar6 = uVar6 + uVar5;
      }
      (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture = mVar2;
      if (frameCount <= uVar6 && uVar6 != frameCount) {
        __assert_fail("totalPCMFramesProcessed <= frameCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                      ,0x25c1,
                      "ma_result ma_device_read__null(ma_device *, void *, ma_uint32, ma_uint32 *)")
        ;
      }
      mVar2 = frameCount;
      if (uVar6 == frameCount) break;
      uVar1 = (pDevice->capture).internalPeriodSizeInFrames;
      uVar5 = (pDevice->field_23).null_device.lastProcessedFrameCapture + uVar1;
      if ((pDevice->field_23).null_device.isStarted != 0) {
        do {
          mVar3 = ma_device_get_total_run_time_in_frames__null(pDevice);
          if (uVar5 <= mVar3) break;
          local_40.tv_sec = 0;
          local_40.tv_nsec = 10000000;
          nanosleep(&local_40,(timespec *)0x0);
        } while ((pDevice->field_23).null_device.isStarted != 0);
        uVar1 = (pDevice->capture).internalPeriodSizeInFrames;
        uVar5 = (pDevice->field_23).null_device.lastProcessedFrameCapture + uVar1;
      }
      (pDevice->field_23).null_device.lastProcessedFrameCapture = uVar5;
      (pDevice->field_23).null_device.currentPeriodFramesRemainingCapture = uVar1;
      mVar2 = uVar6;
    } while (uVar6 < frameCount);
  }
  if (pFramesRead != (ma_uint32 *)0x0) {
    *pFramesRead = mVar2;
  }
  return (ma_result)pFramesRead;
}

Assistant:

static ma_result ma_device_read__null(ma_device* pDevice, void* pPCMFrames, ma_uint32 frameCount, ma_uint32* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_uint32 totalPCMFramesProcessed;

    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    /* Keep going until everything has been read. */
    totalPCMFramesProcessed = 0;
    while (totalPCMFramesProcessed < frameCount) {
        ma_uint64 targetFrame;

        /* If there are any frames remaining in the current period, consume those first. */
        if (pDevice->null_device.currentPeriodFramesRemainingCapture > 0) {
            ma_uint32 bpf = ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels);
            ma_uint32 framesRemaining = (frameCount - totalPCMFramesProcessed);
            ma_uint32 framesToProcess = pDevice->null_device.currentPeriodFramesRemainingCapture;
            if (framesToProcess > framesRemaining) {
                framesToProcess = framesRemaining;
            }

            /* We need to ensured the output buffer is zeroed. */
            MA_ZERO_MEMORY(ma_offset_ptr(pPCMFrames, totalPCMFramesProcessed*bpf), framesToProcess*bpf);

            pDevice->null_device.currentPeriodFramesRemainingCapture -= framesToProcess;
            totalPCMFramesProcessed += framesToProcess;
        }

        /* If we've consumed the current period we'll need to mark it as such an ensure the device is started if it's not already. */
        if (pDevice->null_device.currentPeriodFramesRemainingCapture == 0) {
            pDevice->null_device.currentPeriodFramesRemainingCapture = 0;
        }

        /* If we've consumed the whole buffer we can return now. */
        MA_ASSERT(totalPCMFramesProcessed <= frameCount);
        if (totalPCMFramesProcessed == frameCount) {
            break;
        }

        /* Getting here means we've still got more frames to consume, we but need to wait for it to become available. */
        targetFrame = pDevice->null_device.lastProcessedFrameCapture + pDevice->capture.internalPeriodSizeInFrames;
        for (;;) {
            ma_uint64 currentFrame;

            /* Stop waiting if the device has been stopped. */
            if (!pDevice->null_device.isStarted) {
                break;
            }

            currentFrame = ma_device_get_total_run_time_in_frames__null(pDevice);
            if (currentFrame >= targetFrame) {
                break;
            }

            /* Getting here means we haven't yet reached the target sample, so continue waiting. */
            ma_sleep(10);
        }

        pDevice->null_device.lastProcessedFrameCapture          += pDevice->capture.internalPeriodSizeInFrames;
        pDevice->null_device.currentPeriodFramesRemainingCapture = pDevice->capture.internalPeriodSizeInFrames;
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalPCMFramesProcessed;
    }

    return result;
}